

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

void cJSON_Minify(char *json)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  char *into;
  char *pcVar4;
  
  pcVar4 = json;
LAB_00107a0e:
  for (; (((cVar3 = *pcVar4, cVar3 == '\t' || (cVar3 == '\n')) || (cVar3 == '\r')) || (cVar3 == ' ')
         ); pcVar4 = pcVar4 + 1) {
  }
  if (cVar3 == '\"') {
    *json = '\"';
    do {
      cVar3 = pcVar4[1];
      if (cVar3 == '\\') {
        json[1] = '\\';
        json = json + 2;
        cVar3 = pcVar4[2];
        pcVar4 = pcVar4 + 2;
      }
      else {
        if ((cVar3 == '\0') || (cVar3 == '\"')) goto LAB_00107a71;
        json = json + 1;
        pcVar4 = pcVar4 + 1;
      }
      *json = cVar3;
    } while( true );
  }
  if (cVar3 == '/') {
    cVar2 = pcVar4[1];
    if (cVar2 == '/') {
      while ((cVar2 != '\0' && (cVar2 != '\n'))) {
        pcVar1 = pcVar4 + 1;
        pcVar4 = pcVar4 + 1;
        cVar2 = *pcVar1;
      }
      goto LAB_00107a0e;
    }
    if (cVar2 == '*') {
      pcVar4 = pcVar4 + 2;
      cVar3 = '/';
      do {
        if (cVar3 == '*') {
          cVar3 = pcVar4[-1];
          if (cVar3 == '/') goto LAB_00107a0e;
        }
        else {
          if (cVar3 == '\0') goto LAB_00107a0e;
          cVar3 = pcVar4[-1];
        }
        pcVar4 = pcVar4 + 1;
      } while( true );
    }
  }
  else if (cVar3 == '\0') {
    *json = '\0';
    return;
  }
  pcVar4 = pcVar4 + 1;
  *json = cVar3;
  json = json + 1;
  goto LAB_00107a0e;
LAB_00107a71:
  pcVar4 = pcVar4 + 2;
  json[1] = cVar3;
  json = json + 2;
  goto LAB_00107a0e;
}

Assistant:

void cJSON_Minify(char *json)
{
	char *into=json;
	while (*json)
	{
		if (*json==' ') json++;
		else if (*json=='\t') json++;	/* Whitespace characters. */
		else if (*json=='\r') json++;
		else if (*json=='\n') json++;
		else if (*json=='/' && json[1]=='/')  while (*json && *json!='\n') json++;	/* double-slash comments, to end of line. */
		else if (*json=='/' && json[1]=='*') {while (*json && !(*json=='*' && json[1]=='/')) json++;json+=2;}	/* multiline comments. */
		else if (*json=='\"'){*into++=*json++;while (*json && *json!='\"'){if (*json=='\\') *into++=*json++;*into++=*json++;}*into++=*json++;} /* string literals, which are \" sensitive. */
		else *into++=*json++;			/* All other characters. */
	}
	*into=0;	/* and null-terminate. */
}